

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gia_GlaDumpAbsracted(Gla_Man_t *p,int fVerbose)

{
  Gia_Man_t *local_40;
  Vec_Int_t *local_38;
  Vec_Int_t *vGateClasses;
  Gia_Man_t *pAbs;
  char *pFileName;
  char *pFileNameDef;
  Gla_Man_t *pGStack_10;
  int fVerbose_local;
  Gla_Man_t *p_local;
  
  pFileName = "glabs.aig";
  if (p->pPars->pFileVabs == (char *)0x0) {
    local_40 = (Gia_Man_t *)0xbb5c22;
  }
  else {
    local_40 = (Gia_Man_t *)p->pPars->pFileVabs;
  }
  pAbs = local_40;
  pFileNameDef._4_4_ = fVerbose;
  pGStack_10 = p;
  if (fVerbose != 0) {
    Abc_Print(1,"Dumping abstracted model into file \"%s\"...\n",local_40);
  }
  local_38 = Gla_ManTranslate(pGStack_10);
  vGateClasses = (Vec_Int_t *)Gia_ManDupAbsGates(pGStack_10->pGia0,local_38);
  Vec_IntFreeP(&local_38);
  Gia_AigerWrite((Gia_Man_t *)vGateClasses,(char *)pAbs,0,0);
  Gia_ManStop((Gia_Man_t *)vGateClasses);
  return;
}

Assistant:

void Gia_GlaDumpAbsracted( Gla_Man_t * p, int fVerbose )
{
    char * pFileNameDef = "glabs.aig";
    char * pFileName = p->pPars->pFileVabs ? p->pPars->pFileVabs : pFileNameDef;
    Gia_Man_t * pAbs;
    Vec_Int_t * vGateClasses;
    if ( fVerbose )
        Abc_Print( 1, "Dumping abstracted model into file \"%s\"...\n", pFileName );
    // create abstraction
    vGateClasses = Gla_ManTranslate( p );
    pAbs = Gia_ManDupAbsGates( p->pGia0, vGateClasses );
    Vec_IntFreeP( &vGateClasses );
    // write into file
    Gia_AigerWrite( pAbs, pFileName, 0, 0 );
    Gia_ManStop( pAbs );
}